

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_states.cpp
# Opt level: O2

PClassActor * FState::StaticFindStateOwner(FState *state)

{
  PClassActor *pPVar1;
  uint i;
  ulong uVar2;
  
  uVar2 = 0;
  while( true ) {
    if (PClassActor::AllActorClasses.Count <= uVar2) {
      return (PClassActor *)0x0;
    }
    pPVar1 = PClassActor::AllActorClasses.Array[uVar2];
    if ((pPVar1->OwnedStates <= state) && (state < pPVar1->OwnedStates + pPVar1->NumOwnedStates))
    break;
    uVar2 = uVar2 + 1;
  }
  return pPVar1;
}

Assistant:

PClassActor *FState::StaticFindStateOwner (const FState *state)
{
	for (unsigned int i = 0; i < PClassActor::AllActorClasses.Size(); ++i)
	{
		PClassActor *info = PClassActor::AllActorClasses[i];
		if (state >= info->OwnedStates &&
			state <  info->OwnedStates + info->NumOwnedStates)
		{
			return info;
		}
	}

	return NULL;
}